

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

void time_boost<boost::random::inversive_congruential_engine<unsigned_int,9102u,2110599482u,2147483647u>>
               (inversive_congruential_engine<unsigned_int,_9102U,_2110599482U,_2147483647U> *r,
               string *name)

{
  result_type_conflict rVar1;
  ulong uVar2;
  string *in_RSI;
  result_type_conflict res_plain;
  stringstream s;
  stringstream local_198 [16];
  ostream local_188 [56];
  inversive_congruential_engine<unsigned_int,_9102U,_2110599482U,_2147483647U>
  *in_stack_fffffffffffffeb0;
  
  std::__cxx11::stringstream::stringstream(local_198);
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (0x1f < uVar2) break;
    std::__cxx11::string::operator+=(in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,in_RSI);
  rVar1 = time_plain<boost::random::inversive_congruential_engine<unsigned_int,9102u,2110599482u,2147483647u>>
                    (in_stack_fffffffffffffeb0);
  std::ostream::operator<<(local_188,rVar1);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void time_boost(R &r, std::string name) {
  std::stringstream s;  // write data to stream to prevent that code gets optimized away
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  const auto res_plain = time_plain(r);
  s << res_plain;
  std::cout << std::endl;
}